

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O0

int qc_staticlist_get_at(QcStaticList *staticList,int cell)

{
  int cell_00;
  int cell_01;
  int *piVar1;
  void *pvVar2;
  int *piVar3;
  _StaticCell *nextCell;
  _StaticCell *preCell;
  _StaticCell *curCell;
  int next;
  int pre;
  int cell_local;
  QcStaticList *staticList_local;
  
  if (((staticList == (QcStaticList *)0x0) || (cell < 0)) || (staticList->limit <= cell)) {
    staticList_local._4_4_ = -1;
  }
  else if (staticList->head == -99) {
    staticList_local._4_4_ = -99;
  }
  else {
    piVar1 = (int *)get_staticlist_cell(staticList,cell);
    cell_00 = *piVar1;
    cell_01 = piVar1[1];
    if (cell_00 == -99) {
      staticList->head = cell_01;
    }
    else {
      pvVar2 = get_staticlist_cell(staticList,cell_00);
      *(int *)((long)pvVar2 + 4) = cell_01;
    }
    if (cell_01 == -99) {
      staticList->tail = cell_00;
    }
    else {
      piVar3 = (int *)get_staticlist_cell(staticList,cell_01);
      *piVar3 = cell_00;
    }
    staticList->num = staticList->num + -1;
    *piVar1 = -99;
    piVar1[1] = -99;
    staticList_local._4_4_ = cell;
  }
  return staticList_local._4_4_;
}

Assistant:

int qc_staticlist_get_at(QcStaticList *staticList, int cell)
{
    int pre, next;
    _StaticCell *curCell, *preCell, *nextCell;

    if(NULL == staticList || cell<0 || cell>=staticList->limit)
        return -1;

    if(staticList->head == QC_INVALID_INT)
        return QC_INVALID_INT;

    curCell = get_staticlist_cell(staticList, cell);

    pre  = curCell->previous;
    next = curCell->next;
    
    if(pre != QC_INVALID_INT)
    {
        preCell = get_staticlist_cell(staticList, pre);
        preCell->next = next;
    }
    else
    {
        staticList->head = next;
    }

    if(next != QC_INVALID_INT)
    {
        nextCell = get_staticlist_cell(staticList, next);
        nextCell->previous = pre;
    }
    else
    {
        staticList->tail = pre;
    }

    staticList->num --;

    curCell->previous  = QC_INVALID_INT;
    curCell->next = QC_INVALID_INT;

    return cell;
}